

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchInitRegsBinary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  Vec_Ptr_t *p;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int local_38;
  int local_34;
  int w;
  int i;
  uint *pSim;
  Aig_Obj_t *pObj;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  for (local_34 = 0; iVar1 = Saig_ManRegNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar3 = Vec_PtrEntry(p,local_34 + iVar1);
    pvVar4 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar3 + 0x24));
    for (local_38 = 0; local_38 < nWords; local_38 = local_38 + 1) {
      uVar2 = Saig_SynchTernary((uint)(*(ulong *)((long)pvVar3 + 0x18) >> 4) & 1);
      *(uint *)((long)pvVar4 + (long)local_38 * 4) = uVar2;
    }
  }
  return;
}

Assistant:

void Saig_SynchInitRegsBinary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pObj->fMarkA );
    }
}